

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O2

IString __thiscall wasm::Wasm2JSBuilder::getTemp(Wasm2JSBuilder *this,Type type,Function *func)

{
  pointer *ppIVar1;
  unordered_map<wasm::Type,_std::vector<wasm::IString,_std::allocator<wasm::IString>_>,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<std::pair<const_wasm::Type,_std::vector<wasm::IString,_std::allocator<wasm::IString>_>_>_>_>
  *this_00;
  uint __val;
  mapped_type *pmVar2;
  mapped_type *pmVar3;
  size_t sVar4;
  iterator iVar5;
  Type in_R8;
  Name NVar6;
  string_view sVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  key_type local_40;
  Type type_local;
  
  local_40.id = type.id;
  if ((type.id & 1) == 0 || type.id < 7) {
    this_00 = &this->frees;
    pmVar2 = std::__detail::
             _Map_base<wasm::Type,_std::pair<const_wasm::Type,_std::vector<wasm::IString,_std::allocator<wasm::IString>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::vector<wasm::IString,_std::allocator<wasm::IString>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<wasm::Type,_std::pair<const_wasm::Type,_std::vector<wasm::IString,_std::allocator<wasm::IString>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::vector<wasm::IString,_std::allocator<wasm::IString>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)this_00,&local_40);
    if ((pmVar2->super__Vector_base<wasm::IString,_std::allocator<wasm::IString>_>)._M_impl.
        super__Vector_impl_data._M_finish ==
        (pmVar2->super__Vector_base<wasm::IString,_std::allocator<wasm::IString>_>)._M_impl.
        super__Vector_impl_data._M_start) {
      pmVar3 = std::__detail::
               _Map_base<wasm::Type,_std::pair<const_wasm::Type,_unsigned_int>,_std::allocator<std::pair<const_wasm::Type,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<wasm::Type,_std::pair<const_wasm::Type,_unsigned_int>,_std::allocator<std::pair<const_wasm::Type,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&this->temps,&local_40);
      __val = *pmVar3;
      *pmVar3 = __val + 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c0,"wasm2js_",(allocator<char> *)((long)&type_local.id + 7));
      ::wasm::Type::toString_abi_cxx11_();
      std::operator+(&local_e0,&local_c0,&local_a0);
      std::operator+(&local_100,&local_e0,"$");
      std::__cxx11::to_string(&local_80,__val);
      std::operator+(&local_60,&local_100,&local_80);
      sVar4 = strlen(local_60._M_dataplus._M_p);
      NVar6.super_IString.str =
           (IString)::wasm::IString::interned(sVar4,local_60._M_dataplus._M_p,0);
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_c0);
      sVar7 = (string_view)fromName(this,NVar6,Local);
    }
    else {
      pmVar2 = std::__detail::
               _Map_base<wasm::Type,_std::pair<const_wasm::Type,_std::vector<wasm::IString,_std::allocator<wasm::IString>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::vector<wasm::IString,_std::allocator<wasm::IString>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<wasm::Type,_std::pair<const_wasm::Type,_std::vector<wasm::IString,_std::allocator<wasm::IString>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::vector<wasm::IString,_std::allocator<wasm::IString>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)this_00,&local_40);
      sVar7 = (pmVar2->super__Vector_base<wasm::IString,_std::allocator<wasm::IString>_>)._M_impl.
              super__Vector_impl_data._M_finish[-1].str;
      pmVar2 = std::__detail::
               _Map_base<wasm::Type,_std::pair<const_wasm::Type,_std::vector<wasm::IString,_std::allocator<wasm::IString>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::vector<wasm::IString,_std::allocator<wasm::IString>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<wasm::Type,_std::pair<const_wasm::Type,_std::vector<wasm::IString,_std::allocator<wasm::IString>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::vector<wasm::IString,_std::allocator<wasm::IString>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)this_00,&local_40);
      ppIVar1 = &(pmVar2->super__Vector_base<wasm::IString,_std::allocator<wasm::IString>_>)._M_impl
                 .super__Vector_impl_data._M_finish;
      *ppIVar1 = *ppIVar1 + -1;
    }
    local_60._0_16_ = sVar7;
    iVar5 = std::
            _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(func->localIndices)._M_h,(key_type *)&local_60);
    if (iVar5.super__Node_iterator_base<std::pair<const_wasm::Name,_unsigned_int>,_true>._M_cur ==
        (__node_type *)0x0) {
      NVar6.super_IString.str._M_str = (char *)local_40.id;
      NVar6.super_IString.str._M_len = (size_t)sVar7._M_str;
      Builder::addVar((Builder *)func,(Function *)sVar7._M_len,NVar6,in_R8);
    }
    return (IString)sVar7;
  }
  __assert_fail("!type.isTuple() && \"Unexpected tuple type\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm2js.h"
                ,0xd3,"IString wasm::Wasm2JSBuilder::getTemp(Type, Function *)");
}

Assistant:

IString getTemp(Type type, Function* func) {
    IString ret;
    // TODO: handle tuples
    assert(!type.isTuple() && "Unexpected tuple type");
    if (frees[type].size() > 0) {
      ret = frees[type].back();
      frees[type].pop_back();
    } else {
      auto index = temps[type]++;
      ret = IString((std::string("wasm2js_") + type.toString() + "$" +
                     std::to_string(index))
                      .c_str(),
                    false);
      ret = fromName(ret, NameScope::Local);
    }
    if (func->localIndices.find(ret) == func->localIndices.end()) {
      Builder::addVar(func, ret, type);
    }
    return ret;
  }